

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O0

void __thiscall
TEST_MockReturnValueTest_MatchingReturnValueOnWhileSignature_TestShell::
TEST_MockReturnValueTest_MatchingReturnValueOnWhileSignature_TestShell
          (TEST_MockReturnValueTest_MatchingReturnValueOnWhileSignature_TestShell *this)

{
  TEST_MockReturnValueTest_MatchingReturnValueOnWhileSignature_TestShell *this_local;
  
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell =
       (_func_int **)
       &PTR__TEST_MockReturnValueTest_MatchingReturnValueOnWhileSignature_TestShell_00348478;
  return;
}

Assistant:

TEST(MockReturnValueTest, MatchingReturnValueOnWhileSignature)
{
    mock().expectOneCall("foo").withParameter("p1", 1).andReturnValue(1);
    mock().expectOneCall("foo").withParameter("p1", 2).andReturnValue(2);
    mock().expectOneCall("foo").withParameter("p1", 3).andReturnValue(3);
    mock().expectOneCall("foo").ignoreOtherParameters().andReturnValue(4);

    LONGS_EQUAL(3, mock().actualCall("foo").withParameter("p1", 3).returnValue().getIntValue());
    LONGS_EQUAL(4, mock().actualCall("foo").withParameter("p1", 4).returnValue().getIntValue());
    LONGS_EQUAL(1, mock().actualCall("foo").withParameter("p1", 1).returnValue().getIntValue());
    LONGS_EQUAL(2, mock().actualCall("foo").withParameter("p1", 2).returnValue().getIntValue());
}